

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O2

bool UTF_u_to_u8<(char)63>(UTF_US16 *us16,UTF_US8 *us8)

{
  pointer pcVar1;
  bool bVar2;
  uchar __c;
  pointer pcVar3;
  UTF_UC8 uc8 [4];
  char16_t local_2c;
  char16_t local_2a;
  
  pcVar3 = (us16->_M_dataplus)._M_p;
  pcVar1 = pcVar3 + us16->_M_string_length;
  do {
    if (pcVar3 == pcVar1) {
      return true;
    }
    local_2c = *pcVar3;
    if ((local_2c & 0xfc00U) == 0xd800) {
      pcVar3 = pcVar3 + 1;
      if (pcVar3 == pcVar1) {
        std::__cxx11::
        basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
        ::push_back(us8,'?');
        return true;
      }
      local_2a = *pcVar3;
    }
    else {
      local_2a = L'\0';
    }
    bVar2 = UTF_uc16_to_uc8(&local_2c,uc8);
    __c = '?';
    if ((!bVar2) ||
       (((std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::push_back(us8,uc8[0]), uc8[1] != '\0' &&
         (std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::push_back(us8,uc8[1]), uc8[2] != '\0')) &&
        (std::__cxx11::
         basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
         ::push_back(us8,uc8[2]), __c = uc8[3], uc8[3] != '\0')))) {
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      push_back(us8,__c);
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

inline bool
UTF_u_to_u8(const UTF_US16& us16, UTF_US8& us8)
{
    UTF_UC16 uc16[2];
    UTF_UC8 uc8[4];
    UTF_US16::const_iterator it, end = us16.end();
    for (it = us16.begin(); it != end; ++it)
    {
        if (UTF_uc16_is_surrogate_high(*it))
        {
            uc16[0] = *it;
            ++it;
            if (it == end)
            {
                if (!t_default_char)
                    return false;

                us8.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
                return true;
            }

            uc16[1] = *it;
        }
        else
        {
            uc16[0] = *it;
            uc16[1] = 0;
        }

        if (!UTF_uc16_to_uc8(uc16, uc8))
        {
            if (!t_default_char)
                return false;

            us8.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
            continue;
        }

        us8.push_back(uc8[0]);
        if (uc8[1])
        {
            us8.push_back(uc8[1]);
            if (uc8[2])
            {
                us8.push_back(uc8[2]);
                if (uc8[3])
                {
                    us8.push_back(uc8[3]);
                }
            }
        }
    }

    return true;
}